

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warrior.cpp
# Opt level: O0

int __thiscall derick::shoot(derick *this)

{
  int iVar1;
  derick *this_local;
  
  iVar1 = warrior::getAmmo(&this->super_warrior);
  if (iVar1 < 2) {
    iVar1 = warrior::getAmmo(&this->super_warrior);
    if (iVar1 == 1) {
      warrior::consumeAmmo(&this->super_warrior,1);
      std::operator<<((ostream *)&std::cout,"One Shot Is Fired!\n");
      this_local._4_4_ = 1;
    }
    else {
      std::operator<<((ostream *)&std::cout,
                      "The Hammer Falls..........But No Shots Are Heard, Out of Ammo!\n");
      this_local._4_4_ = 0;
    }
  }
  else {
    warrior::consumeAmmo(&this->super_warrior,2);
    std::operator<<((ostream *)&std::cout,"Two Shots Are Fired!\n");
    this_local._4_4_ = 2;
  }
  return this_local._4_4_;
}

Assistant:

int derick::shoot() {
    //function to attempt to shoot bullets, returns number of bullets fired
    //returns 2 if 2 bullets fired
    //returns 1 if 1 bullet fired
    //returns 0 if out of ammo
    if (getAmmo() > 1) {
        consumeAmmo(2);
        std::cout << "Two Shots Are Fired!\n";
        return 2;
    } else if (getAmmo() == 1) {
        consumeAmmo(1);
        std::cout << "One Shot Is Fired!\n";
        return 1;
    } else
        std::cout << "The Hammer Falls..........But No Shots Are Heard, Out of Ammo!\n";
        return 0;
}